

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

void __thiscall
capnp::DynamicStruct::Reader::Reader(Reader *this,StructSchema schema,OrphanBuilder *orphan)

{
  StructSize size;
  StructSchema in_RAX;
  
  (this->schema).super_Schema.raw = (RawBrandedSchema *)schema.super_Schema.raw;
  size = anon_unknown_71::structSizeFromSchema(in_RAX);
  capnp::_::OrphanBuilder::asStructReader(&this->reader,orphan,size);
  return;
}

Assistant:

DynamicStruct::Reader::Reader(StructSchema schema, const _::OrphanBuilder& orphan)
    : schema(schema), reader(orphan.asStructReader(structSizeFromSchema(schema))) {}